

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedicated.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1252b8::DedicatedState::update
          (DedicatedState *this,ALCcontext *param_2,EffectSlot *slot,EffectProps *props,
          EffectTarget target)

{
  float *in_RCX;
  long in_RDX;
  long in_RDI;
  long in_R8;
  long in_R9;
  float fVar1;
  array<float,_16UL> coeffs;
  ALuint idx_1;
  ALuint idx;
  float Gain;
  float *in_stack_ffffffffffffff38;
  float spread;
  RealMixParams *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff54;
  ALuint AVar2;
  float ingain;
  float *in_stack_ffffffffffffff80;
  MixParams *in_stack_ffffffffffffff88;
  span<float,_16UL> in_stack_ffffffffffffff90;
  
  std::begin<float,16ul>((float (*) [16])(in_RDI + 0x60));
  std::end<float,16ul>((float (*) [16])(in_RDI + 0x60));
  std::fill<float*,float>
            ((float *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(float *)0x1d52d1);
  fVar1 = *(float *)(in_RDX + 0x98) * *in_RCX;
  spread = (float)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  if (*(int *)(in_RDX + 0xa8) == 0x9000) {
    if (in_R9 == 0) {
      AVar2 = 0xffffffff;
    }
    else {
      AVar2 = GetChannelIdxByName(in_stack_ffffffffffffff40,(Channel)spread);
    }
    if (AVar2 != 0xffffffff) {
      *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_R9 + 0x50);
      *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_R9 + 0x58);
      *(float *)(in_RDI + 0x60 + (ulong)AVar2 * 4) = fVar1;
    }
  }
  else if (*(int *)(in_RDX + 0xa8) == 0x9001) {
    if (in_R9 == 0) {
      AVar2 = 0xffffffff;
    }
    else {
      AVar2 = GetChannelIdxByName(in_stack_ffffffffffffff40,(Channel)spread);
    }
    if (AVar2 == 0xffffffff) {
      ingain = -1.0;
      CalcDirectionCoeffs((float (*) [3])in_stack_ffffffffffffff40,spread);
      *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_R8 + 0x80);
      *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_R8 + 0x88);
      std::array<float,_16UL>::data((array<float,_16UL> *)0x1d547f);
      al::span<float,_16UL>::span
                ((span<float,_16UL> *)CONCAT44(in_stack_ffffffffffffff54,AVar2),
                 (element_type_conflict2 (*) [16])CONCAT44(fVar1,in_stack_ffffffffffffff48));
      ComputePanGains(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,ingain,
                      in_stack_ffffffffffffff90);
    }
    else {
      *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_R9 + 0x50);
      *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_R9 + 0x58);
      *(float *)(in_RDI + 0x60 + (ulong)AVar2 * 4) = fVar1;
    }
  }
  return;
}

Assistant:

void DedicatedState::update(const ALCcontext*, const EffectSlot *slot,
    const EffectProps *props, const EffectTarget target)
{
    std::fill(std::begin(mTargetGains), std::end(mTargetGains), 0.0f);

    const float Gain{slot->Gain * props->Dedicated.Gain};

    if(slot->EffectType == AL_EFFECT_DEDICATED_LOW_FREQUENCY_EFFECT)
    {
        const ALuint idx{!target.RealOut ? INVALID_CHANNEL_INDEX :
            GetChannelIdxByName(*target.RealOut, LFE)};
        if(idx != INVALID_CHANNEL_INDEX)
        {
            mOutTarget = target.RealOut->Buffer;
            mTargetGains[idx] = Gain;
        }
    }
    else if(slot->EffectType == AL_EFFECT_DEDICATED_DIALOGUE)
    {
        /* Dialog goes to the front-center speaker if it exists, otherwise it
         * plays from the front-center location. */
        const ALuint idx{!target.RealOut ? INVALID_CHANNEL_INDEX :
            GetChannelIdxByName(*target.RealOut, FrontCenter)};
        if(idx != INVALID_CHANNEL_INDEX)
        {
            mOutTarget = target.RealOut->Buffer;
            mTargetGains[idx] = Gain;
        }
        else
        {
            const auto coeffs = CalcDirectionCoeffs({0.0f, 0.0f, -1.0f}, 0.0f);

            mOutTarget = target.Main->Buffer;
            ComputePanGains(target.Main, coeffs.data(), Gain, mTargetGains);
        }
    }
}